

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5ExprPhraseCollist(Fts5Expr *pExpr,int iPhrase,u8 **ppCollist,int *pnCollist)

{
  Fts5ExprPhrase *pFVar1;
  long iRowid;
  Fts5ExprTerm *pFVar2;
  int iVar3;
  
  pFVar1 = pExpr->apExprPhrase[iPhrase];
  if (((pFVar1->pNode->bEof == 0) &&
      (iRowid = pFVar1->pNode->iRowid, iRowid == pExpr->pRoot->iRowid)) && (0 < (pFVar1->poslist).n)
     ) {
    pFVar2 = pFVar1->aTerm[0].pSynonym;
    if (pFVar2 != (Fts5ExprTerm *)0x0) {
      iVar3 = fts5ExprSynonymList(pFVar1->aTerm,iRowid,(Fts5Buffer *)(pFVar2 + 1),ppCollist,
                                  pnCollist);
      return iVar3;
    }
    *ppCollist = (pFVar1->aTerm[0].pIter)->pData;
    *pnCollist = (pFVar1->aTerm[0].pIter)->nData;
  }
  else {
    *ppCollist = (u8 *)0x0;
    *pnCollist = 0;
  }
  return 0;
}

Assistant:

static int sqlite3Fts5ExprPhraseCollist(
  Fts5Expr *pExpr,
  int iPhrase,
  const u8 **ppCollist,
  int *pnCollist
){
  Fts5ExprPhrase *pPhrase = pExpr->apExprPhrase[iPhrase];
  Fts5ExprNode *pNode = pPhrase->pNode;
  int rc = SQLITE_OK;

  assert( iPhrase>=0 && iPhrase<pExpr->nPhrase );
  assert( pExpr->pConfig->eDetail==FTS5_DETAIL_COLUMNS );

  if( pNode->bEof==0
   && pNode->iRowid==pExpr->pRoot->iRowid
   && pPhrase->poslist.n>0
  ){
    Fts5ExprTerm *pTerm = &pPhrase->aTerm[0];
    if( pTerm->pSynonym ){
      Fts5Buffer *pBuf = (Fts5Buffer*)&pTerm->pSynonym[1];
      rc = fts5ExprSynonymList(
          pTerm, pNode->iRowid, pBuf, (u8**)ppCollist, pnCollist
      );
    }else{
      *ppCollist = pPhrase->aTerm[0].pIter->pData;
      *pnCollist = pPhrase->aTerm[0].pIter->nData;
    }
  }else{
    *ppCollist = 0;
    *pnCollist = 0;
  }

  return rc;
}